

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readTags(WasmBinaryReader *this)

{
  type_conflict1 tVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  ostream *poVar5;
  type *ptVar6;
  type_conflict1 *ptVar7;
  pointer pTVar8;
  char *pcVar9;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar10;
  string_view sVar11;
  Signature sig;
  Name name_00;
  Name name_01;
  Name name_02;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *in_stack_fffffffffffffe08;
  HeapType local_150;
  char *local_148;
  HeapType HStack_140;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_130;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> tag;
  uint32_t typeIndex;
  type_conflict1 *isExplicit;
  type *name_1;
  string local_108;
  string_view local_e8;
  pair<wasm::Name,_bool> local_d8;
  ulong local_c0;
  size_t i;
  undefined1 local_b0;
  ostream *local_a8;
  char *pcStack_a0;
  type *local_88;
  type *name;
  type *index;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_70;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *__range1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  size_type numImports;
  size_t num;
  WasmBinaryReader *this_local;
  
  uVar3 = getU32LEB(this);
  usedNames._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
       ::size(&this->wasm->tags);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range1);
  __end1 = std::
           unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
           ::begin(&this->tagNames);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
       ::end(&this->tagNames);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>,
                       &local_70);
    if (!bVar2) break;
    index = &std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>
             ::operator*(&__end1)->first;
    name = (type *)std::get<0ul,unsigned_int_const,wasm::Name>
                             ((pair<const_unsigned_int,_wasm::Name> *)index);
    local_88 = std::get<1ul,unsigned_int_const,wasm::Name>
                         ((pair<const_unsigned_int,_wasm::Name> *)index);
    pcVar9 = (char *)((long)&(usedNames._M_h._M_single_bucket)->_M_nxt + (ulong)uVar3);
    if (pcVar9 <= (char *)(ulong)(uint)(name->super_IString).str._M_len) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "warning: tag index out of bounds in name section: ");
      local_a8 = (ostream *)(local_88->super_IString).str._M_len;
      pcStack_a0 = (local_88->super_IString).str._M_str;
      name_00.super_IString.str._M_str = pcVar9;
      name_00.super_IString.str._M_len = (size_t)pcStack_a0;
      poVar5 = wasm::operator<<((wasm *)poVar5,local_a8,name_00);
      poVar5 = std::operator<<(poVar5," at index ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)(name->super_IString).str._M_len);
      std::operator<<(poVar5,'\n');
    }
    pVar10 = std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&__range1,local_88);
    i = (size_t)pVar10.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
    local_b0 = pVar10.second;
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
    operator++(&__end1);
  }
  for (local_c0 = 0; local_c0 < uVar3; local_c0 = local_c0 + 1) {
    getInt8(this);
    uVar4 = (int)usedNames._M_h._M_single_bucket + (int)local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"tag$",(allocator<char> *)((long)&name_1 + 7));
    sVar11 = (string_view)makeName(&local_108,local_c0);
    name_01.super_IString.str._M_str = (char *)&__range1;
    name_01.super_IString.str._M_len = (size_t)sVar11._M_str;
    local_e8 = sVar11;
    getOrMakeName(&local_d8,(wasm *)&this->tagNames,
                  (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   *)(ulong)uVar4,(Index)sVar11._M_len,name_01,in_stack_fffffffffffffe08);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)((long)&name_1 + 7));
    ptVar6 = std::get<0ul,wasm::Name,bool>(&local_d8);
    ptVar7 = std::get<1ul,wasm::Name,bool>(&local_d8);
    tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._4_4_ = getU32LEB(this);
    local_148 = (char *)(ptVar6->super_IString).str._M_len;
    HStack_140.id = (uintptr_t)(ptVar6->super_IString).str._M_str;
    sig = getSignatureByTypeIndex
                    (this,tag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                          ._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                          .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._4_4_);
    HeapType::HeapType(&local_150,sig);
    name_02.super_IString.str._M_str = local_148;
    name_02.super_IString.str._M_len = (size_t)&local_130;
    Builder::makeTag(name_02,HStack_140);
    tVar1 = *ptVar7;
    pTVar8 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_130);
    (pTVar8->super_Importable).super_Named.hasExplicitName = (bool)(tVar1 & 1);
    Module::addTag(this->wasm,&local_130);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_130);
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range1);
  return;
}

Assistant:

void WasmBinaryReader::readTags() {
  size_t num = getU32LEB();
  auto numImports = wasm.tags.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : tagNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: tag index out of bounds in name section: " << name
                << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    getInt8(); // Reserved 'attribute' field
    auto [name, isExplicit] =
      getOrMakeName(tagNames, numImports + i, makeName("tag$", i), usedNames);
    auto typeIndex = getU32LEB();
    auto tag = Builder::makeTag(name, getSignatureByTypeIndex(typeIndex));
    tag->hasExplicitName = isExplicit;
    wasm.addTag(std::move(tag));
  }
}